

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O3

Dim * __thiscall
cnn::FoldRows::dim_forward
          (Dim *__return_storage_ptr__,FoldRows *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  uint uVar2;
  pointer pDVar3;
  long lVar4;
  ostream *poVar5;
  invalid_argument *this_00;
  uint local_18 [2];
  
  pDVar3 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_18[0] = pDVar3->d[0] / this->nrows;
  if (((this->nrows * local_18[0] == pDVar3->d[0]) &&
      ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pDVar3 == 0x24)) && (pDVar3->nd == 2)) {
    local_18[1] = pDVar3->d[1];
    __return_storage_ptr__->nd = 0;
    __return_storage_ptr__->bd = 1;
    lVar4 = 0;
    do {
      uVar1 = *(uint *)((long)local_18 + lVar4);
      uVar2 = __return_storage_ptr__->nd;
      __return_storage_ptr__->nd = uVar2 + 1;
      __return_storage_ptr__->d[uVar2] = uVar1;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 8);
    return __return_storage_ptr__;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Bad input dimensions in FoldRows: ",0x22);
  poVar5 = operator<<((ostream *)&std::cerr,xs);
  std::endl<char,std::char_traits<char>>(poVar5);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"bad input dimensions in FoldRows");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim FoldRows::dim_forward(const vector<Dim>& xs) const {
  unsigned orows = xs[0].rows() / nrows;
  if ((orows * nrows != xs[0].rows()) || xs.size() != 1 || xs[0].ndims() != 2) {
    cerr << "Bad input dimensions in FoldRows: " << xs << endl;
    throw std::invalid_argument("bad input dimensions in FoldRows");
  }
  return Dim({orows, xs[0].cols()});
}